

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::addOutput
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr spec)

{
  ArrayPtr<const_char> name;
  bool bVar1;
  int iVar2;
  NullableValue<unsigned_long> *pNVar3;
  unsigned_long *puVar4;
  char *__file;
  Filesystem *pFVar5;
  undefined4 extraout_var;
  StringPtr SVar6;
  ArrayPtr<const_char> AVar7;
  bool local_2bb;
  bool local_2b9;
  Maybe<kj::Path> local_278;
  ArrayPtr<const_char> local_258;
  OutputDirective local_248;
  size_t local_218;
  char *pcStack_210;
  PathPtr local_200;
  Path local_1f0;
  Maybe<kj::Path> local_1d8;
  char *local_1b8;
  char *pcStack_1b0;
  OutputDirective local_1a0;
  int local_16c;
  undefined1 local_168 [8];
  stat stats;
  StringPtr local_b8;
  undefined1 local_a8 [8];
  NullableValue<unsigned_long> split2;
  StringPtr local_88;
  char *pcStack_78;
  ArrayPtr<const_char> plugin;
  StringPtr dir;
  StringPtr local_48;
  undefined1 local_38 [8];
  NullableValue<unsigned_long> split;
  CompilerMain *this_local;
  StringPtr spec_local;
  
  spec_local.content.ptr = (char *)spec.content.size_;
  this_local = (CompilerMain *)spec.content.ptr;
  split.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)this;
  spec_local.content.size_ = (size_t)__return_storage_ptr__;
  kj::StringPtr::findFirst(&local_48,(char)&this_local);
  pNVar3 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_48);
  kj::_::NullableValue<unsigned_long>::NullableValue
            ((NullableValue<unsigned_long> *)local_38,pNVar3);
  kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_48);
  puVar4 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_38);
  if (puVar4 == (unsigned_long *)0x0) {
    local_258 = kj::StringPtr::asArray((StringPtr *)&this_local);
    kj::Maybe<kj::Path>::Maybe(&local_278,(void *)0x0);
    OutputDirective::OutputDirective(&local_248,local_258,&local_278);
    kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::
    add<capnp::compiler::CompilerMain::OutputDirective>(&this->outputs,&local_248);
    OutputDirective::~OutputDirective(&local_248);
    kj::Maybe<kj::Path>::~Maybe(&local_278);
  }
  else {
    puVar4 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_38);
    SVar6 = kj::StringPtr::slice((StringPtr *)&this_local,*puVar4 + 1);
    dir.content.ptr = (char *)SVar6.content.size_;
    plugin.size_ = (size_t)SVar6.content.ptr;
    puVar4 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_38);
    AVar7 = kj::StringPtr::slice((StringPtr *)&this_local,0,*puVar4);
    plugin.ptr = (char *)AVar7.size_;
    pcStack_78 = AVar7.ptr;
    puVar4 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_38);
    local_2b9 = false;
    if (*puVar4 == 1) {
      kj::StringPtr::StringPtr(&local_88,"/");
      bVar1 = kj::StringPtr::startsWith((StringPtr *)&plugin.size_,&local_88);
      local_2bb = true;
      if (!bVar1) {
        kj::StringPtr::StringPtr((StringPtr *)&split2.field_1,"\\");
        local_2bb = kj::StringPtr::startsWith
                              ((StringPtr *)&plugin.size_,(StringPtr *)&split2.field_1);
      }
      local_2b9 = local_2bb;
    }
    if (local_2b9 != false) {
      kj::StringPtr::findFirst(&local_b8,(char)&plugin + '\b');
      pNVar3 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_b8);
      kj::_::NullableValue<unsigned_long>::NullableValue
                ((NullableValue<unsigned_long> *)local_a8,pNVar3);
      kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_b8);
      puVar4 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_a8);
      AVar7.size_ = (size_t)plugin.ptr;
      AVar7.ptr = (char *)stats.__glibc_reserved[2];
      if (puVar4 != (unsigned_long *)0x0) {
        puVar4 = kj::_::NullableValue<unsigned_long>::operator*
                           ((NullableValue<unsigned_long> *)local_a8);
        SVar6 = kj::StringPtr::slice((StringPtr *)&plugin.size_,*puVar4 + 1);
        dir.content.ptr = (char *)SVar6.content.size_;
        plugin.size_ = (size_t)SVar6.content.ptr;
        puVar4 = kj::_::NullableValue<unsigned_long>::operator*
                           ((NullableValue<unsigned_long> *)local_a8);
        AVar7 = kj::StringPtr::slice((StringPtr *)&this_local,0,*puVar4 + 2);
        pcStack_78 = AVar7.ptr;
      }
      plugin.ptr = (char *)AVar7.size_;
      stats.__glibc_reserved[2] = (__syscall_slong_t)AVar7.ptr;
      kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_a8);
    }
    __file = kj::StringPtr::cStr((StringPtr *)&plugin.size_);
    iVar2 = stat(__file,(stat *)local_168);
    if ((iVar2 < 0) || (((uint)stats.st_nlink & 0xf000) != 0x4000)) {
      kj::MainBuilder::Validity::Validity
                (__return_storage_ptr__,"output location is inaccessible or is not a directory");
      local_16c = 1;
      goto LAB_003154d0;
    }
    local_1b8 = pcStack_78;
    pcStack_1b0 = plugin.ptr;
    pFVar5 = kj::Own<kj::Filesystem>::operator->(&this->disk);
    iVar2 = (*pFVar5->_vptr_Filesystem[2])();
    local_200.parts.ptr = (String *)CONCAT44(extraout_var,iVar2);
    local_218 = plugin.size_;
    pcStack_210 = dir.content.ptr;
    SVar6.content.size_ = (size_t)dir.content.ptr;
    SVar6.content.ptr = (char *)plugin.size_;
    kj::PathPtr::evalNative(&local_1f0,&local_200,SVar6);
    kj::Maybe<kj::Path>::Maybe(&local_1d8,&local_1f0);
    name.size_ = (size_t)pcStack_1b0;
    name.ptr = local_1b8;
    OutputDirective::OutputDirective(&local_1a0,name,&local_1d8);
    kj::Vector<capnp::compiler::CompilerMain::OutputDirective>::
    add<capnp::compiler::CompilerMain::OutputDirective>(&this->outputs,&local_1a0);
    OutputDirective::~OutputDirective(&local_1a0);
    kj::Maybe<kj::Path>::~Maybe(&local_1d8);
    kj::Path::~Path(&local_1f0);
  }
  local_16c = 0;
LAB_003154d0:
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_38);
  if (local_16c == 0) {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addOutput(kj::StringPtr spec) {
    KJ_IF_MAYBE(split, spec.findFirst(':')) {
      kj::StringPtr dir = spec.slice(*split + 1);
      auto plugin = spec.slice(0, *split);

      if (*split == 1 && (dir.startsWith("/") || dir.startsWith("\\"))) {
        // The colon is the second character and is immediately followed by a slash or backslash.
        // So, the user passed something like `-o c:/foo`. Is this a request to run the C plugin
        // and output to `/foo`? Or are we on Windows, and is this a request to run the plugin
        // `c:/foo`?
        KJ_IF_MAYBE(split2, dir.findFirst(':')) {
          // There are two colons. The first ':' was the second char, and was followed by '/' or
          // '\', e.g.:
          //     capnp compile -o c:/foo.exe:bar
          //
          // In this case we can conclude that the second colon is actually meant to be the
          // plugin/location separator, and the first colon was simply signifying a drive letter.
          //
          // Proof by contradiction:
          // - Say that none of the colons were meant to be plugin/location separators; i.e. the
          //   whole argument is meant to be a plugin indicator and the location defaults to ".".
          //   -> In this case, the plugin path has two colons, which is not valid.
          //   -> CONTRADICTION
          // - Say that the first colon was meant to be the plugin/location separator.
          //   -> In this case, the second colon must be the drive letter separator for the
          //      output location.
          //   -> However, the output location begins with '/' or '\', which is not a drive letter.
          //   -> CONTRADICTION
          // - Say that there are more colons beyond the first two, and one of these is meant to
          //   be the plugin/location separator.
          //   -> In this case, the plugin path has two or more colons, which is not valid.
          //   -> CONTRADICTION
          //
          // We therefore conclude that the *second* colon is in fact the plugin/location separator.

          dir = dir.slice(*split2 + 1);
          plugin = spec.slice(0, *split2 + 2);
#if _WIN32
        } else {
          // The user wrote something like:
          //
          //     capnp compile -o c:/foo/bar
          //
          // What does this mean? It depends on what system we're on. On a Unix system, the above
          // clearly is a request to run the `capnpc-c` plugin (perhaps to output C code) and write
          // to the directory /foo/bar. But on Windows, absolute paths do not start with '/', and
          // the above is actually a request to run the plugin `c:/foo/bar`, outputting to the
          // current directory.

          outputs.add(OutputDirective { spec.asArray(), nullptr });
          return true;
#endif
        }
      }

      struct stat stats;
      if (stat(dir.cStr(), &stats) < 0 || !S_ISDIR(stats.st_mode)) {
        return "output location is inaccessible or is not a directory";
      }
      outputs.add(OutputDirective { plugin, disk->getCurrentPath().evalNative(dir) });
    }